

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::Model
          (Model *this,shared_ptr<fasttext::Matrix> *wi,shared_ptr<fasttext::Matrix> *wo,
          shared_ptr<fasttext::Loss> *loss,bool normalizeGradient)

{
  shared_ptr<fasttext::Loss> *in_RDX;
  long in_RDI;
  byte in_R8B;
  shared_ptr<fasttext::Loss> *in_stack_ffffffffffffffb8;
  
  std::shared_ptr<fasttext::Matrix>::shared_ptr
            ((shared_ptr<fasttext::Matrix> *)in_RDX,
             (shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffffb8);
  std::shared_ptr<fasttext::Matrix>::shared_ptr
            ((shared_ptr<fasttext::Matrix> *)in_RDX,
             (shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffffb8);
  std::shared_ptr<fasttext::Loss>::shared_ptr(in_RDX,in_stack_ffffffffffffffb8);
  *(byte *)(in_RDI + 0x30) = in_R8B & 1;
  return;
}

Assistant:

Model::Model(
    std::shared_ptr<Matrix> wi,
    std::shared_ptr<Matrix> wo,
    std::shared_ptr<Loss> loss,
    bool normalizeGradient)
    : wi_(wi), wo_(wo), loss_(loss), normalizeGradient_(normalizeGradient) {}